

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O2

string * __thiscall
(anonymous_namespace)::StringFixture::convert<unsigned_char*>
          (string *__return_storage_ptr__,void *this,uchar *begin,uchar *end)

{
  string *source;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<unsigned_char*>((string *)local_30);
  anon_unknown.dwarf_11e143::StringFixture::convert
            (__return_storage_ptr__,(StringFixture *)local_30,source);
  std::__cxx11::string::~string((string *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string StringFixture::convert (InputIterator begin, InputIterator end) const {
        return this->convert ({begin, end});
    }